

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

EntryType * __thiscall
JsUtil::
BaseDictionary<Js::PathTypeSuccessorKey,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
::AllocateEntries(BaseDictionary<Js::PathTypeSuccessorKey,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
                  *this,int size,bool zeroAllocate)

{
  undefined1 auVar1 [16];
  Recycler *this_00;
  EntryType *pEVar2;
  code *AllocFunc;
  ulong uVar3;
  size_t byteSize;
  EntryType *pEVar4;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  uVar3 = (ulong)size;
  local_48 = (undefined1  [8])
             &WeakRefValueDictionaryEntry<Js::PathTypeSuccessorKey,Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>>>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_136c13;
  data.filename._0_4_ = 0x453;
  data.plusSize = uVar3;
  this_00 = Memory::Recycler::TrackAllocInfo(this->alloc,(TrackAllocData *)local_48);
  if (size == 0) {
    Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
    pEVar2 = (EntryType *)&DAT_00000008;
  }
  else {
    if (zeroAllocate) {
      AllocFunc = Memory::Recycler::AllocZeroWithBarrier;
    }
    else {
      AllocFunc = Memory::Recycler::AllocWithBarrier;
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar3;
    byteSize = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0x18),8) == 0) {
      byteSize = SUB168(auVar1 * ZEXT816(0x18),0);
    }
    pEVar2 = (EntryType *)
             new__<Memory::Recycler>(byteSize,this_00,(offset_in_Recycler_to_subr)AllocFunc);
    pEVar4 = pEVar2;
    do {
      (pEVar4->
      super_SimpleDictionaryEntry<Js::PathTypeSuccessorKey,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>
      ).
      super_DefaultHashedEntry<Js::PathTypeSuccessorKey,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
      .
      super_KeyValueEntry<Js::PathTypeSuccessorKey,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>
      .
      super_ValueEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::PathTypeSuccessorKey,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>_>
      .
      super_KeyValueEntryDataLayout2<Js::PathTypeSuccessorKey,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>
      .value.ptr = (RecyclerWeakReference<Js::DynamicType> *)0x0;
      Js::PathTypeSuccessorKey::PathTypeSuccessorKey
                (&(pEVar4->
                  super_SimpleDictionaryEntry<Js::PathTypeSuccessorKey,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>
                  ).
                  super_DefaultHashedEntry<Js::PathTypeSuccessorKey,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .
                  super_KeyValueEntry<Js::PathTypeSuccessorKey,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>
                  .
                  super_ValueEntry<Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::PathTypeSuccessorKey,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>_>
                  .
                  super_KeyValueEntryDataLayout2<Js::PathTypeSuccessorKey,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>
                  .key);
      pEVar4 = pEVar4 + 1;
    } while (pEVar4 != pEVar2 + uVar3);
  }
  return pEVar2;
}

Assistant:

EntryType * AllocateEntries(DECLSPEC_GUARD_OVERFLOW int size, const bool zeroAllocate = true)
        {
            // Note that the choice of leaf/non-leaf node is decided for the EntryType on the basis of TValue. By default, if
            // TValue is a pointer, a non-leaf allocation is done. This behavior can be overridden by specializing
            // TypeAllocatorFunc for TValue.
            return
                AllocateArray<AllocatorType, EntryType, false>(
                    TRACK_ALLOC_INFO(alloc, EntryType, AllocatorType, 0, size),
                    zeroAllocate ? EntryAllocatorFuncType::GetAllocZeroFunc() : EntryAllocatorFuncType::GetAllocFunc(),
                    size);
        }